

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DGXMLScanner::scanReset(DGXMLScanner *this,InputSource *src)

{
  ReaderMgr *this_00;
  XMLDocumentHandler *pXVar1;
  XMLEntityHandler *pXVar2;
  XMLErrorReporter *pXVar3;
  ValidationContext *pVVar4;
  MemoryManager *pMVar5;
  SecurityManager *pSVar6;
  int iVar7;
  DTDGrammar *this_01;
  XMLReader *reader;
  XMLSize_t XVar8;
  RuntimeException *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  GrammarResolver::cacheGrammarFromParse
            ((this->super_XMLScanner).fGrammarResolver,(this->super_XMLScanner).fToCacheGrammar);
  ((this->super_XMLScanner).fGrammarResolver)->fUseCachedGrammar =
       (this->super_XMLScanner).fUseCachedGrammar;
  this_01 = (DTDGrammar *)
            XMemory::operator_new(0x40,(this->super_XMLScanner).fGrammarPoolMemoryManager);
  DTDGrammar::DTDGrammar(this_01,(this->super_XMLScanner).fGrammarPoolMemoryManager);
  this->fDTDGrammar = this_01;
  GrammarResolver::putGrammar((this->super_XMLScanner).fGrammarResolver,(Grammar *)this_01);
  (this->super_XMLScanner).fGrammar = &this->fDTDGrammar->super_Grammar;
  (this->super_XMLScanner).fRootGrammar = (Grammar *)0x0;
  (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xb])();
  (this->super_XMLScanner).fValidate = (this->super_XMLScanner).fValScheme == Val_Always;
  pXVar1 = (this->super_XMLScanner).fDocHandler;
  if (pXVar1 != (XMLDocumentHandler *)0x0) {
    (*pXVar1->_vptr_XMLDocumentHandler[9])();
  }
  pXVar2 = (this->super_XMLScanner).fEntityHandler;
  if (pXVar2 != (XMLEntityHandler *)0x0) {
    (*pXVar2->_vptr_XMLEntityHandler[4])();
  }
  pXVar3 = (this->super_XMLScanner).fErrorReporter;
  if (pXVar3 != (XMLErrorReporter *)0x0) {
    (*pXVar3->_vptr_XMLErrorReporter[3])();
  }
  (*((this->super_XMLScanner).fValidationContext)->_vptr_ValidationContext[4])();
  pVVar4 = (this->super_XMLScanner).fValidationContext;
  (*pVVar4->_vptr_ValidationContext[9])(pVVar4,0);
  (this->super_XMLScanner).fEntityDeclPoolRetrieved = false;
  pMVar5 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar5->_vptr_MemoryManager[4])(pMVar5,(this->super_XMLScanner).fRootElemName);
  (this->super_XMLScanner).fRootElemName = (XMLCh *)0x0;
  ElemStack::reset(&(this->super_XMLScanner).fElemStack,(this->super_XMLScanner).fEmptyNamespaceId,
                   (this->super_XMLScanner).fUnknownNamespaceId,
                   (this->super_XMLScanner).fXMLNamespaceId,
                   (this->super_XMLScanner).fXMLNSNamespaceId);
  (this->super_XMLScanner).fInException = false;
  (this->super_XMLScanner).fStandalone = false;
  (this->super_XMLScanner).fErrorCount = 0;
  (this->super_XMLScanner).fHasNoDTD = true;
  (*(this->fDTDValidator->super_XMLValidator)._vptr_XMLValidator[6])();
  (this->fDTDValidator->super_XMLValidator).fErrorReporter = (this->super_XMLScanner).fErrorReporter
  ;
  if ((this->super_XMLScanner).fValidatorFromUser == true) {
    (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[6])();
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  reader = ReaderMgr::createReader
                     (this_00,src,true,RefFrom_NonLiteral,Type_General,Source_External,
                      (this->super_XMLScanner).fCalculateSrcOfs,
                      (this->super_XMLScanner).fLowWaterMark);
  if (reader != (XMLReader *)0x0) {
    ReaderMgr::pushReader(this_00,reader,(XMLEntityDecl *)0x0);
    pSVar6 = (this->super_XMLScanner).fSecurityManager;
    if (pSVar6 != (SecurityManager *)0x0) {
      XVar8 = (**(code **)(*(long *)pSVar6 + 0x18))();
      (this->super_XMLScanner).fEntityExpansionLimit = XVar8;
      (this->super_XMLScanner).fEntityExpansionCount = 0;
    }
    if ((this->super_XMLScanner).fUIntPoolRowTotal < 0x20) {
      XMLScanner::resetUIntPool(&this->super_XMLScanner);
    }
    else {
      RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::removeAll(this->fAttDefRegistry);
      XMLScanner::recreateUIntPool(&this->super_XMLScanner);
    }
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
    this->fAttrNSList->fCurCount = 0;
    return;
  }
  iVar7 = (*src->_vptr_InputSource[6])(src);
  this_02 = (RuntimeException *)__cxa_allocate_exception(0x30);
  if ((char)iVar7 == '\0') {
    iVar7 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (this_02,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x9a9,Scan_CouldNotOpenSource_Warning,(XMLCh *)CONCAT44(extraout_var_00,iVar7),
               (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  else {
    iVar7 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (this_02,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x9a7,Scan_CouldNotOpenSource,(XMLCh *)CONCAT44(extraout_var,iVar7),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  __cxa_throw(this_02,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void DGXMLScanner::scanReset(const InputSource& src)
{

    //  This call implicitly tells us that we are going to reuse the scanner
    //  if it was previously used. So tell the validator to reset itself.
    //
    //  But, if the fUseCacheGrammar flag is set, then don't reset it.
    //
    //  NOTE:   The ReaderMgr is flushed on the way out, because that is
    //          required to insure that files are closed.
    fGrammarResolver->cacheGrammarFromParse(fToCacheGrammar);
    fGrammarResolver->useCachedGrammarInParse(fUseCachedGrammar);

    fDTDGrammar = new (fGrammarPoolMemoryManager) DTDGrammar(fGrammarPoolMemoryManager);
    fGrammarResolver->putGrammar(fDTDGrammar);
    fGrammar = fDTDGrammar;
    fRootGrammar = 0;
    fValidator->setGrammar(fGrammar);

    // Reset validation
    fValidate = (fValScheme == Val_Always) ? true : false;

    //  And for all installed handlers, send reset events. This gives them
    //  a chance to flush any cached data.
    if (fDocHandler)
        fDocHandler->resetDocument();
    if (fEntityHandler)
        fEntityHandler->resetEntities();
    if (fErrorReporter)
        fErrorReporter->resetErrors();

    // Clear out the id reference list
    resetValidationContext();

    // Reset the Root Element Name
    fMemoryManager->deallocate(fRootElemName);//delete [] fRootElemName;
    fRootElemName = 0;

    //  Reset the element stack, and give it the latest ids for the special
    //  URIs it has to know about.
    fElemStack.reset
    (
        fEmptyNamespaceId
        , fUnknownNamespaceId
        , fXMLNamespaceId
        , fXMLNSNamespaceId
    );

    // Reset some status flags
    fInException = false;
    fStandalone = false;
    fErrorCount = 0;
    fHasNoDTD = true;

    // Reset the validators
    fDTDValidator->reset();
    fDTDValidator->setErrorReporter(fErrorReporter);
    if (fValidatorFromUser)
        fValidator->reset();

    //  Handle the creation of the XML reader object for this input source.
    //  This will provide us with transcoding and basic lexing services.
    XMLReader* newReader = fReaderMgr.createReader
    (
        src
        , true
        , XMLReader::RefFrom_NonLiteral
        , XMLReader::Type_General
        , XMLReader::Source_External
        , fCalculateSrcOfs
        , fLowWaterMark
    );

    if (!newReader) {
        if (src.getIssueFatalErrorIfNotFound())
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource, src.getSystemId(), fMemoryManager);
        else
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource_Warning, src.getSystemId(), fMemoryManager);
    }

    // Push this read onto the reader manager
    fReaderMgr.pushReader(newReader, 0);

    // and reset security-related things if necessary:
    if(fSecurityManager != 0)
    {
        fEntityExpansionLimit = fSecurityManager->getEntityExpansionLimit();
        fEntityExpansionCount = 0;
    }
    if(fUIntPoolRowTotal >= 32)
    { // 8 KB tied up with validating attributes...
        fAttDefRegistry->removeAll();
        recreateUIntPool();
    }
    else
    {
        // note that this will implicitly reset the values of the hashtables,
        // though their buckets will still be tied up
        resetUIntPool();
    }
    fUndeclaredAttrRegistry->removeAll();
    fAttrNSList->removeAllElements();
}